

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O1

void add2C(int v)

{
  _WordT *p_Var1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  ulong __position;
  ulong uVar8;
  long lVar9;
  
  __position = (ulong)v;
  std::bitset<15000UL>::reset(&P,__position);
  sizeP = sizeP + -1;
  iVar2 = CE_P_[__position];
  if (iVar2 < 1) {
    if (14999 < (uint)v) goto LAB_0011761b;
    p_Var1 = Cm.super__Base_bitset<235UL>._M_w + (__position >> 6);
    *p_Var1 = *p_Var1 | 1L << ((byte)v & 0x3f);
    piVar5 = NAdjB;
    CE_Cm_Cm = CE_Cm_Cm + CE_Cm_[__position];
    CE_Cm_Cp = CE_Cm_Cp + CE_Cp_[__position];
    lVar7 = (long)NAdjP[__position];
    iVar3 = NAdjP[(ulong)(uint)v + 1];
    if (NAdjP[__position] < iVar3) {
      do {
        CE_Cm_[piVar5[lVar7]] = CE_Cm_[piVar5[lVar7]] + 1;
        lVar7 = lVar7 + 1;
      } while (iVar3 != lVar7);
    }
  }
  else {
    if (14999 < (uint)v) {
LAB_0011761b:
      std::__throw_out_of_range_fmt
                ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",__position,
                 15000);
    }
    p_Var1 = Cp.super__Base_bitset<235UL>._M_w + (__position >> 6);
    *p_Var1 = *p_Var1 | 1L << ((byte)v & 0x3f);
    piVar5 = NAdjB;
    CE_Cp_Cp = CE_Cp_Cp + CE_Cp_[__position];
    CE_Cp_P = CE_Cp_P + iVar2;
    CE_Cm_Cp = CE_Cm_Cp + CE_Cm_[__position];
    lVar7 = (long)NAdjP[__position];
    iVar3 = NAdjP[(ulong)(uint)v + 1];
    if (NAdjP[__position] < iVar3) {
      do {
        CE_Cp_[piVar5[lVar7]] = CE_Cp_[piVar5[lVar7]] + 1;
        lVar7 = lVar7 + 1;
      } while (iVar3 != lVar7);
    }
  }
  piVar5 = AdjB;
  sizeC = sizeC + 1;
  CE_P_P = CE_P_P - iVar2;
  cnt_lP = cnt_lP + -1;
  lVar7 = (long)AdjP[__position];
  iVar2 = AdjP[__position + 1];
  if (AdjP[__position] < iVar2) {
    do {
      iVar3 = piVar5[lVar7];
      neiC[iVar3] = neiC[iVar3] + 1;
      neiP[iVar3] = neiP[iVar3] + -1;
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  lVar7 = (long)NAdjP[__position];
  if (NAdjP[__position] < NAdjP[__position + 1]) {
    piVar5 = NAdjB + lVar7;
    lVar9 = lVar7 * 4;
    do {
      lVar9 = lVar9 + 4;
      iVar2 = *piVar5;
      uVar6 = (ulong)iVar2;
      iVar3 = CE_P_[uVar6];
      CE_P_[uVar6] = iVar3 + -1;
      uVar4 = Cp.super__Base_bitset<235UL>._M_w[uVar6 >> 6];
      uVar8 = 1L << ((byte)iVar2 & 0x3f);
      if (((uVar4 >> (uVar6 & 0x3f) & 1) != 0) ||
         ((Cm.super__Base_bitset<235UL>._M_w[uVar6 >> 6] & uVar8) != 0)) {
        CE_Cp_P = CE_Cp_P + -1;
      }
      if (iVar3 + -1 == 0 && (uVar4 & uVar8) != 0) {
        add_from_Cp_to_Cm(iVar2);
      }
      lVar7 = lVar7 + 1;
      piVar5 = (int *)((long)NAdjB + lVar9);
    } while (lVar7 < NAdjP[__position + 1]);
  }
  return;
}

Assistant:

inline void add2C(int v) {
    P.reset(v); --sizeP;
    if (CE_P_[v] > 0) {Cp.set(v); in_Cp(v);}
    else {Cm.set(v); in_Cm(v);}
    ++sizeC;

    CE_P_P -= CE_P_[v];
    --cnt_lP;

    FOR_NA(v, u) {++neiC[u]; --neiP[u];}

    FOR_C_NA(v, u) {
        --CE_P_[u];
        if (Cp[u] || Cm[u]) --CE_Cp_P;
        if (CE_P_[u] == 0 && Cp[u])
            add_from_Cp_to_Cm(u);
    }
}